

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

void ggml_set_i32_1d(ggml_tensor *tensor,int i,int32_t value)

{
  ggml_type gVar1;
  void *pvVar2;
  char cVar3;
  ggml_bf16_t gVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  int64_t id [4];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 auStack_30 [2];
  undefined1 auVar8 [64];
  
  cVar3 = ggml_is_contiguous();
  auVar8._8_56_ = extraout_var;
  auVar8._0_8_ = extraout_XMM0_Qa;
  if (cVar3 == '\0') {
    local_48 = 0;
    uStack_40 = 0;
    uStack_38 = 0;
    auStack_30[0] = 0;
    ggml_unravel_index(tensor,(long)i,&local_48,&uStack_40,&uStack_38,auStack_30);
    ggml_set_i32_nd(tensor,(int)local_48,(int)uStack_40,(int)uStack_38,(int)auStack_30[0],value);
  }
  else {
    gVar1 = tensor->type;
    auVar7._4_12_ = auVar8._4_12_;
    switch(gVar1) {
    case GGML_TYPE_I8:
      if (tensor->nb[0] != 1) {
        pcVar5 = "tensor->nb[0] == sizeof(int8_t)";
        uVar6 = 0x3b8;
LAB_0010d213:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,uVar6,"GGML_ASSERT(%s) failed",pcVar5);
      }
      *(char *)((long)tensor->data + (long)i) = (char)value;
      break;
    case GGML_TYPE_I16:
      if (tensor->nb[0] != 2) {
        pcVar5 = "tensor->nb[0] == sizeof(int16_t)";
        uVar6 = 0x3bd;
        goto LAB_0010d213;
      }
      *(short *)((long)tensor->data + (long)i * 2) = (short)value;
      break;
    case GGML_TYPE_I32:
      if (tensor->nb[0] != 4) {
        pcVar5 = "tensor->nb[0] == sizeof(int32_t)";
        uVar6 = 0x3c2;
        goto LAB_0010d213;
      }
      *(int32_t *)((long)tensor->data + (long)i * 4) = value;
      break;
    case GGML_TYPE_I64:
    case GGML_TYPE_F64:
    case GGML_TYPE_IQ1_M:
switchD_0010d02a_caseD_1b:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x3d6,"fatal error");
    case GGML_TYPE_BF16:
      if (tensor->nb[0] != 2) {
        pcVar5 = "tensor->nb[0] == sizeof(ggml_bf16_t)";
        uVar6 = 0x3cc;
        goto LAB_0010d213;
      }
      pvVar2 = tensor->data;
      gVar4 = ggml_compute_fp32_to_bf16((float)value);
      *(uint16_t *)((long)pvVar2 + (long)i * 2) = gVar4.bits;
      break;
    default:
      if (gVar1 == GGML_TYPE_F32) {
        if (tensor->nb[0] != 4) {
          pcVar5 = "tensor->nb[0] == sizeof(float)";
          uVar6 = 0x3d1;
          goto LAB_0010d213;
        }
        *(float *)((long)tensor->data + (long)i * 4) = (float)value;
      }
      else {
        if (gVar1 != GGML_TYPE_F16) goto switchD_0010d02a_caseD_1b;
        if (tensor->nb[0] != 2) {
          pcVar5 = "tensor->nb[0] == sizeof(ggml_fp16_t)";
          uVar6 = 0x3c7;
          goto LAB_0010d213;
        }
        auVar7._0_4_ = (float)value;
        auVar7 = vcvtps2ph_f16c(auVar7,0);
        vpextrw_avx(auVar7,0);
      }
    }
  }
  return;
}

Assistant:

void ggml_set_i32_1d(const struct ggml_tensor * tensor, int i, int32_t value) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        ggml_set_i32_nd(tensor, id[0], id[1], id[2], id[3], value);
        return;
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                ((int8_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                ((int16_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                ((int32_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                ((ggml_fp16_t *)(tensor->data))[i] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_BF16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_bf16_t));
                ((ggml_bf16_t *)(tensor->data))[i] = GGML_FP32_TO_BF16(value);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                ((float *)(tensor->data))[i] = value;
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}